

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

size_t __thiscall google::protobuf::Message::ByteSizeLong(Message *this)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  sVar2 = internal::WireFormat::ByteSize(this);
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[4])(this);
  uVar3 = (ulong)*(uint *)(CONCAT44(extraout_var,iVar1) + 0x38);
  if (((int)sVar2 != 0) ||
     (*(int *)((long)&(this->super_MessageLite)._vptr_MessageLite + uVar3) != 0)) {
    *(int *)((long)&(this->super_MessageLite)._vptr_MessageLite + uVar3) = (int)sVar2;
  }
  return sVar2;
}

Assistant:

size_t Message::ByteSizeLong() const {
  size_t size = WireFormat::ByteSize(*this);
  AccessCachedSize().Set(internal::ToCachedSize(size));
  return size;
}